

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::removeRows(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *this,int *nums,int n,int *perm)

{
  int *piVar1;
  int iVar2;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int i;
  DataArray<int> p;
  DataArray<int> *this_00;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_48;
  DataArray<int> local_38;
  long local_20;
  int local_14;
  long local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (in_RCX == 0) {
    nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)0x1c87c7);
    this_00 = &local_38;
    DataArray<int>::DataArray
              ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98,
               (Real)this_00);
    piVar1 = DataArray<int>::get_ptr(this_00);
    (**(code **)(*in_RDI + 0x98))(in_RDI,local_10,local_14,piVar1);
    DataArray<int>::~DataArray(this_00);
  }
  else {
    local_20 = in_RCX;
    local_48 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)0x1c8859);
    while (local_48 = local_48 + -1, -1 < local_48) {
      *(int *)(local_20 + (long)local_48 * 4) = local_48;
    }
    while (iVar2 = local_14 + -1, local_14 != 0) {
      *(undefined4 *)(local_20 + (long)*(int *)(local_10 + (long)iVar2 * 4) * 4) = 0xffffffff;
      local_14 = iVar2;
    }
    local_14 = iVar2;
    (**(code **)(*in_RDI + 0x88))(in_RDI,local_20);
  }
  return;
}

Assistant:

virtual void removeRows(int nums[], int n, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         DataArray < int > p(nRows());
         removeRows(nums, n, p.get_ptr());
         return;
      }

      for(int i = nRows() - 1; i >= 0; --i)
         perm[i] = i;

      while(n--)
         perm[nums[n]] = -1;

      removeRows(perm);
   }